

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::SetEnum
          (ExtensionSet *this,int number,FieldType type,int value,FieldDescriptor *descriptor)

{
  byte *pbVar1;
  byte bVar2;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  _Var3;
  LogMessage *pLVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_bool>
  pVar5;
  LogFinisher local_d1;
  LogMessage local_d0;
  LogMessage local_98;
  LogMessage local_60;
  
  local_d0.filename_ = (char *)0x0;
  local_d0.line_ = 0;
  local_d0._20_4_ = 0;
  local_d0.message_._M_dataplus._M_p = (pointer)0x0;
  local_d0.level_ = number;
  pVar5 = std::
          _Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
          ::_M_emplace_unique<std::pair<int,google::protobuf::internal::ExtensionSet::Extension>>
                    ((_Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                      *)this,(pair<int,_google::protobuf::internal::ExtensionSet::Extension> *)
                             &local_d0);
  _Var3 = pVar5.first._M_node;
  _Var3._M_node[1]._M_right = (_Base_ptr)descriptor;
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (*(char *)((long)&_Var3._M_node[1]._M_left + 1) != '\0') {
      LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1ba);
      pLVar4 = LogMessage::operator<<
                         (&local_98,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (OPTIONAL): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_d0,pLVar4);
      LogMessage::~LogMessage(&local_98);
    }
    bVar2 = *(byte *)&_Var3._M_node[1]._M_left;
    if ((byte)(bVar2 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_d0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x34);
      pLVar4 = LogMessage::operator<<
                         (&local_d0,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_60,pLVar4);
      LogMessage::~LogMessage(&local_d0);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar2 * 4) != 8) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1ba);
      pLVar4 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=(&local_d1,pLVar4);
      LogMessage::~LogMessage(&local_60);
    }
  }
  else {
    *(FieldType *)&_Var3._M_node[1]._M_left = type;
    if ((byte)(type - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_d0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x34);
      pLVar4 = LogMessage::operator<<
                         (&local_d0,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_98,pLVar4);
      LogMessage::~LogMessage(&local_d0);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) != 8) {
      LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1b7);
      pLVar4 = LogMessage::operator<<
                         (&local_98,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_60,pLVar4);
      LogMessage::~LogMessage(&local_98);
    }
    *(undefined1 *)((long)&_Var3._M_node[1]._M_left + 1) = 0;
  }
  pbVar1 = (byte *)((long)&_Var3._M_node[1]._M_left + 2);
  *pbVar1 = *pbVar1 & 0xf0;
  *(int *)&_Var3._M_node[1]._M_parent = value;
  return;
}

Assistant:

void ExtensionSet::SetEnum(int number, FieldType type, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = false;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, ENUM);
  }
  extension->is_cleared = false;
  extension->enum_value = value;
}